

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_cooling_mist(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  AFFECT_DATA af;
  
  bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_cooling_mist);
  if (bVar1) {
    send_to_char("They are already surrounded by a cooling mist.\n\r",ch);
    return;
  }
  if (ch != (CHAR_DATA *)vo) {
    act("You conjure a soothing mist to refresh $N and shelter $M from heat.",ch,(void *)0x0,vo,3);
  }
  act("A soothing mist envelops you, sheltering you from heat.",(CHAR_DATA *)vo,(void *)0x0,
      (void *)0x0,3);
  act("A light mist envelops $n as $e appears soothed.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
  init_affect(&af);
  af.where = 3;
  af.aftype = 0;
  af.type = gsn_cooling_mist;
  af.level = (short)level;
  af.location = 0;
  af.modifier = 0;
  af.duration = (short)((long)level / 3);
  af.bitvector[0]._0_1_ = (byte)af.bitvector[0] | 0x80;
  af.end_fun = (AFF_FUN *)0x0;
  af.tick_fun = (AFF_FUN *)0x0;
  af.mod_name = 0xc;
  af.owner = ch;
  affect_to_char((CHAR_DATA *)vo,&af);
  return;
}

Assistant:

void spell_cooling_mist(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, gsn_cooling_mist))
	{
		send_to_char("They are already surrounded by a cooling mist.\n\r", ch);
		return;
	}

	if (ch != victim)
		act("You conjure a soothing mist to refresh $N and shelter $M from heat.", ch, 0, victim, TO_CHAR);

	act("A soothing mist envelops you, sheltering you from heat.", victim, 0, 0, TO_CHAR);
	act("A light mist envelops $n as $e appears soothed.", victim, 0, 0, TO_ROOM);

	init_affect(&af);
	af.where = TO_RESIST;
	af.aftype = AFT_SPELL;
	af.type = gsn_cooling_mist;
	af.owner = ch;
	af.level = level;
	af.location = 0;
	af.modifier = 0;
	af.duration = level / 3;

	SET_BIT(af.bitvector, RES_FIRE);

	af.end_fun = 0;
	af.tick_fun = 0;
	af.mod_name = MOD_RESISTANCE;
	affect_to_char(victim, &af);
}